

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManAddClauses(Gla_Man_t *p,int iObj,int iFrame,Vec_Int_t *vLits)

{
  int **ppiVar1;
  sat_solver2 *s;
  int iVar2;
  int iVar;
  uint uVar3;
  uint uVar4;
  Gla_Obj_t *pGVar5;
  long lVar6;
  int **ppiVar7;
  Vec_Int_t *pVVar8;
  uint *puVar9;
  int in_R8D;
  long lVar10;
  int local_38;
  uint local_34;
  
  pVVar8 = vLits;
  pGVar5 = Gla_ManObj(p,iObj);
  iVar2 = (int)pVVar8;
  uVar3 = *(uint *)&pGVar5->field_0x4;
  if ((uVar3 & 4) != 0) {
LAB_004f2a2e:
    iVar = Gla_ManGetVar(p,iObj,iFrame);
    sat_solver2_add_const(p->pSat,iVar,iObj,iVar2,in_R8D);
    return;
  }
  if ((uVar3 & 0x20) == 0) {
    if (-1 < (char)uVar3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGlaOld.c"
                    ,0x54f,"void Gla_ManAddClauses(Gla_Man_t *, int, int, Vec_Int_t *)");
    }
    lVar10 = (long)p->pCnf->pObj2Clause[pGVar5->iGiaObj];
    lVar6 = p->pCnf->pObj2Count[pGVar5->iGiaObj] + lVar10;
    while (lVar10 < lVar6) {
      vLits->nSize = 0;
      ppiVar7 = p->pCnf->pClauses;
      ppiVar1 = ppiVar7 + lVar10;
      lVar10 = lVar10 + 1;
      for (puVar9 = (uint *)*ppiVar1; puVar9 < ppiVar7[lVar10]; puVar9 = puVar9 + 1) {
        iVar2 = Gla_ManGetVar(p,(int)*puVar9 >> 1,iFrame);
        Vec_IntPush(vLits,(*puVar9 & 1) + iVar2 * 2);
        ppiVar7 = p->pCnf->pClauses;
      }
      sat_solver2_addclause(p->pSat,vLits->pArray,vLits->pArray + vLits->nSize,iObj);
    }
  }
  else {
    if ((uVar3 & 0xfffffe00) != 0x200) {
      __assert_fail("pGlaObj->nFanins == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGlaOld.c"
                    ,0x532,"void Gla_ManAddClauses(Gla_Man_t *, int, int, Vec_Int_t *)");
    }
    if (iFrame == 0) {
      iFrame = 0;
      goto LAB_004f2a2e;
    }
    uVar3 = Gla_ManGetVar(p,iObj,iFrame);
    uVar4 = Gla_ManGetVar(p,pGVar5->Fanins[0],iFrame + -1);
    if ((int)(uVar4 | uVar3) < 0) {
      __assert_fail("iVarA >= 0 && iVarB >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.h"
                    ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)");
    }
    s = p->pSat;
    local_38 = uVar3 * 2;
    uVar4 = (*(uint *)&pGVar5->field_0x4 >> 1 & 1) + uVar4 * 2;
    local_34 = uVar4 ^ 1;
    sat_solver2_addclause(s,&local_38,(lit *)&stack0xffffffffffffffd0,iObj);
    local_38 = uVar3 * 2 + 1;
    local_34 = uVar4;
    sat_solver2_addclause(s,&local_38,(lit *)&stack0xffffffffffffffd0,iObj);
  }
  return;
}

Assistant:

void Gla_ManAddClauses( Gla_Man_t * p, int iObj, int iFrame, Vec_Int_t * vLits )
{
    Gla_Obj_t * pGlaObj = Gla_ManObj( p, iObj );
    int iVar, iVar1, iVar2;
    if ( pGlaObj->fConst )
    {
        iVar = Gla_ManGetVar( p, iObj, iFrame );
        sat_solver2_add_const( p->pSat, iVar, 1, 0, iObj );
    }
    else if ( pGlaObj->fRo )
    {
        assert( pGlaObj->nFanins == 1 );
        if ( iFrame == 0 )
        {
            iVar = Gla_ManGetVar( p, iObj, iFrame );
            sat_solver2_add_const( p->pSat, iVar, 1, 0, iObj );
        }
        else
        {
            iVar1 = Gla_ManGetVar( p, iObj, iFrame );
            iVar2 = Gla_ManGetVar( p, pGlaObj->Fanins[0], iFrame-1 );
            sat_solver2_add_buffer( p->pSat, iVar1, iVar2, pGlaObj->fCompl0, 0, iObj );
        }
    }
    else if ( pGlaObj->fAnd )
    {
        int i, RetValue, nClauses, iFirstClause, * pLit;
        nClauses = p->pCnf->pObj2Count[pGlaObj->iGiaObj];
        iFirstClause = p->pCnf->pObj2Clause[pGlaObj->iGiaObj];
        for ( i = iFirstClause; i < iFirstClause + nClauses; i++ )
        {
            Vec_IntClear( vLits );
            for ( pLit = p->pCnf->pClauses[i]; pLit < p->pCnf->pClauses[i+1]; pLit++ )
            {
                iVar = Gla_ManGetVar( p, lit_var(*pLit), iFrame );
                Vec_IntPush( vLits, toLitCond( iVar, lit_sign(*pLit) ) );
            }
            RetValue = sat_solver2_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntArray(vLits)+Vec_IntSize(vLits), iObj );
        }
    }
    else assert( 0 );
}